

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

void sb_bmp_clear(uint8_t *bmp,bid_t bid,uint64_t len)

{
  int in_stack_0000002c;
  uint64_t in_stack_00000030;
  bid_t in_stack_00000038;
  uint8_t *in_stack_00000040;
  
  _sb_bmp_update(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
  return;
}

Assistant:

void sb_bmp_clear(uint8_t *bmp, bid_t bid, uint64_t len)
{
    _sb_bmp_update(bmp, bid, len, 0);
}